

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_mem.c
# Opt level: O0

amqp_pool_t * amqp_get_channel_pool(amqp_connection_state_t state,amqp_channel_t channel)

{
  size_t index;
  amqp_pool_table_entry_t *entry;
  amqp_channel_t channel_local;
  amqp_connection_state_t state_local;
  
  entry = state->pool_table[(int)((uint)channel % 0x10)];
  while( true ) {
    if (entry == (amqp_pool_table_entry_t *)0x0) {
      return (amqp_pool_t *)0x0;
    }
    if (channel == entry->channel) break;
    entry = entry->next;
  }
  return &entry->pool;
}

Assistant:

amqp_pool_t *amqp_get_channel_pool(amqp_connection_state_t state,
                                   amqp_channel_t channel) {
  amqp_pool_table_entry_t *entry;
  size_t index = channel % POOL_TABLE_SIZE;

  entry = state->pool_table[index];

  for (; NULL != entry; entry = entry->next) {
    if (channel == entry->channel) {
      return &entry->pool;
    }
  }

  return NULL;
}